

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_add_comment(p_ply ply,char *comment)

{
  size_t sVar1;
  char *__dest;
  long *in_RSI;
  p_ply in_RDI;
  char *new_comment;
  long size;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  size = 0;
  if ((in_RSI != (long *)0x0) && (sVar1 = strlen((char *)in_RSI), sVar1 < 0x400)) {
    __dest = (char *)ply_grow_array((p_ply)CONCAT44(in_stack_fffffffffffffffc,
                                                    in_stack_fffffffffffffff8),(void **)in_RDI,
                                    in_RSI,size);
    if (__dest == (char *)0x0) {
      return 0;
    }
    strcpy(__dest,(char *)in_RSI);
    return 1;
  }
  ply_ferror(in_RDI,"Invalid arguments");
  return 0;
}

Assistant:

int ply_add_comment(p_ply ply, const char *comment) {
    char *new_comment = NULL;
    assert(ply && comment && strlen(comment) < LINESIZE);
    if (!comment || strlen(comment) >= LINESIZE) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    new_comment = (char *) ply_grow_array(ply, (void **) &ply->comment,
            &ply->ncomments, LINESIZE);
    if (!new_comment) return 0;
    strcpy(new_comment, comment);
    return 1;
}